

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_distances.cc
# Opt level: O2

pair<Vector3<double>,_Vector3<double>_> * __thiscall
S2::GetEdgePairClosestPoints
          (pair<Vector3<double>,_Vector3<double>_> *__return_storage_ptr__,S2 *this,S2Point *a0,
          S2Point *a1,S2Point *b0,S2Point *b1)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  pair<Vector3<double>,_Vector3<double>_> *ppVar5;
  ulong uVar6;
  S1ChordAngle min_dist;
  VType VStack_40;
  VType local_38;
  
  iVar3 = CrossingSign((S2Point *)this,a0,a1,b0);
  if (0 < iVar3) {
    GetIntersection((S2Point *)&min_dist,this,a0,a1,b0,b1);
    (__return_storage_ptr__->first).c_[2] = local_38;
    (__return_storage_ptr__->first).c_[0] = min_dist.length2_;
    (__return_storage_ptr__->first).c_[1] = VStack_40;
    (__return_storage_ptr__->second).c_[0] = min_dist.length2_;
    (__return_storage_ptr__->second).c_[1] = VStack_40;
    (__return_storage_ptr__->second).c_[2] = local_38;
    return __return_storage_ptr__;
  }
  min_dist.length2_ = 0.0;
  AlwaysUpdateMinDistance<true>((S2Point *)this,a1,b0,&min_dist);
  bVar1 = AlwaysUpdateMinDistance<false>(a0,a1,b0,&min_dist);
  bVar2 = AlwaysUpdateMinDistance<false>(a1,(S2Point *)this,a0,&min_dist);
  uVar6 = 2;
  if (!bVar2) {
    uVar6 = (ulong)bVar1;
  }
  bVar1 = AlwaysUpdateMinDistance<false>(b0,(S2Point *)this,a0,&min_dist);
  uVar4 = 3;
  if (!bVar1) {
    uVar4 = uVar6;
  }
  ppVar5 = (pair<Vector3<double>,_Vector3<double>_> *)
           (*(code *)(&DAT_002a9f30 + *(int *)(&DAT_002a9f30 + uVar4 * 4)))();
  return ppVar5;
}

Assistant:

std::pair<S2Point, S2Point> GetEdgePairClosestPoints(
      const S2Point& a0, const S2Point& a1,
      const S2Point& b0, const S2Point& b1) {
  if (S2::CrossingSign(a0, a1, b0, b1) > 0) {
    S2Point x = S2::GetIntersection(a0, a1, b0, b1);
    return std::make_pair(x, x);
  }
  // We save some work by first determining which vertex/edge pair achieves
  // the minimum distance, and then computing the closest point on that edge.
  S1ChordAngle min_dist;
  AlwaysUpdateMinDistance<true>(a0, b0, b1, &min_dist);
  enum { A0, A1, B0, B1 } closest_vertex = A0;
  if (UpdateMinDistance(a1, b0, b1, &min_dist)) { closest_vertex = A1; }
  if (UpdateMinDistance(b0, a0, a1, &min_dist)) { closest_vertex = B0; }
  if (UpdateMinDistance(b1, a0, a1, &min_dist)) { closest_vertex = B1; }
  switch (closest_vertex) {
    case A0: return std::make_pair(a0, Project(a0, b0, b1));
    case A1: return std::make_pair(a1, Project(a1, b0, b1));
    case B0: return std::make_pair(Project(b0, a0, a1), b0);
    case B1: return std::make_pair(Project(b1, a0, a1), b1);
    default: S2_LOG(FATAL) << "Unreached (to suppress Android compiler warning)";
  }
}